

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execDivu<(moira::Core)2,(moira::Instr)55,(moira::Mode)8,2>(Moira *this,u16 opcode)

{
  ulong in_RAX;
  int iVar1;
  bool divByZero;
  undefined8 uStack_18;
  
  this->cp = 0;
  uStack_18 = in_RAX & 0xffffffffffffff;
  execDivuMusashi<(moira::Core)2,(moira::Instr)55,(moira::Mode)8,2>
            (this,opcode,(bool *)((long)&uStack_18 + 7));
  iVar1 = 0x30;
  if (uStack_18._7_1_ != '\0') {
    iVar1 = 0x26;
  }
  (*this->_vptr_Moira[2])(this,(ulong)(uint)(iVar1 + this->cp));
  return;
}

Assistant:

void
Moira::execDivu(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    bool divByZero = false;

    if constexpr (MOIRA_MIMIC_MUSASHI) {
        execDivuMusashi<C, I, M, S>(opcode, &divByZero);
    } else {
        execDivuMoira<C, I, M, S>(opcode, &divByZero);
    }

    if (divByZero) {

        CYCLES_68000(38);
        CYCLES_68010(44);
        CYCLES_68020(38);

    } else {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_DN   ( 0,  0,  0,      140,108, 44,       0,  0,  0)
        CYCLES_AI   ( 0,  0,  0,      144,112, 48,       0,  0,  0)
        CYCLES_PI   ( 0,  0,  0,      144,112, 48,       0,  0,  0)
        CYCLES_PD   ( 0,  0,  0,      146,114, 49,       0,  0,  0)
        CYCLES_DI   ( 0,  0,  0,      148,116, 49,       0,  0,  0)
        CYCLES_IX   ( 0,  0,  0,      150,118, 51,       0,  0,  0)
        CYCLES_AW   ( 0,  0,  0,      148,116, 48,       0,  0,  0)
        CYCLES_AL   ( 0,  0,  0,      152,120, 48,       0,  0,  0)
        CYCLES_DIPC ( 0,  0,  0,      148,116, 49,       0,  0,  0)
        CYCLES_IXPC ( 0,  0,  0,      150,118, 51,       0,  0,  0)
        CYCLES_IM   ( 0,  0,  0,      144,112, 46,       0,  0,  0)
    }

    FINALIZE
}